

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerScopedStFld
          (Lowerer *this,Instr *stFldInstr,JnHelperMethod helperMethod,bool withInlineCache,
          bool withPropertyOperationFlags,PropertyOperationFlags flags)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  IntConstOpnd *pIVar5;
  Opnd *pOVar6;
  SymOpnd *this_01;
  undefined4 *puVar7;
  PropertySymOpnd *pPVar8;
  Lowerer *this_02;
  undefined7 in_register_00000081;
  
  pIVar1 = stFldInstr->m_prev;
  if ((int)CONCAT71(in_register_00000081,withPropertyOperationFlags) != 0) {
    pIVar5 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,&pIVar5->super_Opnd);
  }
  if (!withInlineCache) {
    LoadScriptContext(this,stFldInstr);
  }
  pOVar6 = IR::Instr::UnlinkSrc2(stFldInstr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar6);
  pOVar6 = IR::Instr::UnlinkSrc1(stFldInstr);
  LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar6);
  this_01 = (SymOpnd *)IR::Instr::UnlinkDst(stFldInstr);
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005a3bd0;
      *puVar7 = 0;
    }
    if (this_01->m_sym->m_kind != SymKindProperty) goto LAB_005a3a00;
  }
  else {
LAB_005a3a00:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x20e1,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as dst of field store");
    if (!bVar4) goto LAB_005a3bd0;
    *puVar7 = 0;
  }
  LoadPropertySymAsArgument(this,stFldInstr,(Opnd *)this_01);
  if (withInlineCache) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005a3bd0;
      *puVar7 = 0;
    }
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x20e7,"(dst->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar4) {
LAB_005a3bd0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
    pIVar5 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,stFldInstr,&pIVar5->super_Opnd);
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
    pOVar6 = LoadRuntimeInlineCacheOpnd(this,stFldInstr,pPVar8,false);
    this_02 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar6);
    pOVar6 = LoadFunctionBodyOpnd(this_02,stFldInstr);
    LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar6);
  }
  LowererMD::ChangeToHelperCall
            (this_00,stFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedStFld(IR::Instr * stFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache,
    bool withPropertyOperationFlags, Js::PropertyOperationFlags flags)
{
    IR::Instr *instrPrev = stFldInstr->m_prev;

    if (withPropertyOperationFlags)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr,
            IR::IntConstOpnd::New(static_cast<IntConstType>(flags), IRType::TyInt32, m_func, true));
    }

    if(!withInlineCache)
    {
        LoadScriptContext(stFldInstr);
    }

    // Pass the default instance
    IR::Opnd *src = stFldInstr->UnlinkSrc2();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the value to store
    src = stFldInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the property sym to store to
    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");

    this->LoadPropertySymAsArgument(stFldInstr, dst);

    if (withInlineCache)
    {
        AssertMsg(dst->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            stFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(stFldInstr, this->LoadRuntimeInlineCacheOpnd(stFldInstr, dst->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(stFldInstr, LoadFunctionBodyOpnd(stFldInstr));
    }

    m_lowererMD.ChangeToHelperCall(stFldInstr, helperMethod);

    return instrPrev;
}